

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_cad_constrained(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell_00;
  REF_GEOM ref_geom_00;
  uint uVar1;
  REF_INT local_e4;
  REF_INT local_e0;
  int local_dc;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL edge2;
  REF_BOOL edge1;
  REF_BOOL edge0;
  REF_BOOL will_be_collapsed;
  REF_INT nodes [27];
  int local_44;
  REF_INT local_40;
  REF_INT node;
  REF_INT cell;
  REF_INT item;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_geom_00 = ref_grid->geom;
  *allowed = 1;
  if ((node1 < 0) || (ref_cell_00->ref_adj->nnode <= node1)) {
    local_dc = -1;
  }
  else {
    local_dc = ref_cell_00->ref_adj->first[node1];
  }
  node = local_dc;
  if (local_dc == -1) {
    local_e0 = -1;
  }
  else {
    local_e0 = ref_cell_00->ref_adj->item[local_dc].ref;
  }
  local_40 = local_e0;
  do {
    if (node == -1) {
      return 0;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,local_40,&edge0);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x300,"ref_collapse_edge_cad_constrained",(ulong)uVar1,"nodes");
      return uVar1;
    }
    edge1 = 0;
    for (local_44 = 0; local_44 < ref_cell_00->node_per; local_44 = local_44 + 1) {
      if (node0 == (&edge0)[local_44]) {
        edge1 = 1;
      }
    }
    if (edge1 == 0) {
      for (local_44 = 0; local_44 < ref_cell_00->node_per; local_44 = local_44 + 1) {
        if (node1 == (&edge0)[local_44]) {
          (&edge0)[local_44] = node0;
        }
      }
      uVar1 = ref_geom_is_a(ref_geom_00,edge0,1,&edge2);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x309,"ref_collapse_edge_cad_constrained",(ulong)uVar1,"e0");
        return uVar1;
      }
      uVar1 = ref_geom_is_a(ref_geom_00,will_be_collapsed,1,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x30a,"ref_collapse_edge_cad_constrained",(ulong)uVar1,"e1");
        return uVar1;
      }
      uVar1 = ref_geom_is_a(ref_geom_00,nodes[0],1,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x30b,"ref_collapse_edge_cad_constrained",(ulong)uVar1,"e2");
        return uVar1;
      }
      if (((edge2 != 0) && (ref_private_macro_code_rss != 0)) && (ref_private_macro_code_rss_1 != 0)
         ) {
        *allowed = 0;
        return 0;
      }
    }
    node = ref_cell_00->ref_adj->item[node].next;
    if (node == -1) {
      local_e4 = -1;
    }
    else {
      local_e4 = ref_cell_00->ref_adj->item[node].ref;
    }
    local_40 = local_e4;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_cad_constrained(REF_GRID ref_grid,
                                                     REF_INT node0,
                                                     REF_INT node1,
                                                     REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL will_be_collapsed;
  REF_BOOL edge0, edge1, edge2;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_EDGE, &edge0), "e0");
    RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_EDGE, &edge1), "e1");
    RSS(ref_geom_is_a(ref_geom, nodes[2], REF_GEOM_EDGE, &edge2), "e2");
    if (edge0 && edge1 && edge2) {
      *allowed = REF_FALSE;
      break;
    }
  }

  return REF_SUCCESS;
}